

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O2

void Glucose::sort<Glucose::Lit,Glucose::LessThan_default<Glucose::Lit>>(int *array,uint size)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  
  for (; 0xf < (int)size; size = size - (int)uVar6) {
    iVar1 = array[size >> 1];
    uVar4 = (ulong)size;
    uVar6 = 0xffffffffffffffff;
    while( true ) {
      uVar6 = (ulong)(int)uVar6;
      piVar5 = array + uVar6;
      do {
        uVar6 = uVar6 + 1;
        iVar2 = piVar5[1];
        piVar5 = piVar5 + 1;
      } while (iVar2 < iVar1);
      uVar4 = (ulong)(int)uVar4;
      do {
        lVar3 = uVar4 - 1;
        uVar4 = uVar4 - 1;
      } while (iVar1 < array[lVar3]);
      if ((long)uVar4 <= (long)uVar6) break;
      *piVar5 = array[lVar3];
      array[uVar4] = iVar2;
    }
    sort<Glucose::Lit,Glucose::LessThan_default<Glucose::Lit>>(array,uVar6 & 0xffffffff);
    array = piVar5;
  }
  selectionSort<Glucose::Lit,Glucose::LessThan_default<Glucose::Lit>>(array,size);
  return;
}

Assistant:

void sort(T* array, int size, LessThan lt)
{
    if (size <= 15)
        selectionSort(array, size, lt);

    else{
        T           pivot = array[size / 2];
        T           tmp;
        int         i = -1;
        int         j = size;

        for(;;){
            do i++; while(lt(array[i], pivot));
            do j--; while(lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i]; array[i] = array[j]; array[j] = tmp;
        }

        sort(array    , i     , lt);
        sort(&array[i], size-i, lt);
    }
}